

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QList<QtCbor::Element>::squeeze(QList<QtCbor::Element> *this)

{
  ArrayOptions *pAVar1;
  qsizetype qVar2;
  long lVar3;
  Element *b;
  undefined1 auVar4 [16];
  Data *pDVar5;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QtCbor::Element>_*,_QtCbor::Element_*> local_28;
  qsizetype local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->d).d;
  if (pDVar5 != (Data *)0x0) {
    qVar2 = (this->d).size;
    if ((1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
       (qVar2 < (pDVar5->super_QArrayData).alloc)) {
      local_28 = QTypedArrayData<QtCbor::Element>::allocate(qVar2,KeepSize);
      local_18 = 0;
      lVar3 = (this->d).size;
      if (lVar3 != 0) {
        b = (this->d).ptr;
        QtPrivate::QPodArrayOps<QtCbor::Element>::copyAppend
                  ((QPodArrayOps<QtCbor::Element> *)&local_28,b,b + lVar3);
      }
      auVar4._0_8_ = (this->d).d;
      auVar4._8_8_ = (this->d).ptr;
      (this->d).d = local_28.first;
      (this->d).ptr = local_28.second;
      qVar2 = (this->d).size;
      (this->d).size = local_18;
      local_28 = (pair<QTypedArrayData<QtCbor::Element>_*,_QtCbor::Element_*>)auVar4;
      local_18 = qVar2;
      QArrayDataPointer<QtCbor::Element>::~QArrayDataPointer
                ((QArrayDataPointer<QtCbor::Element> *)&local_28);
      pDVar5 = (this->d).d;
      if (pDVar5 == (Data *)0x0) goto LAB_002bb820;
    }
    pAVar1 = &(pDVar5->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
  }
LAB_002bb820:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QList<T>::squeeze()
{
    if (!d.isMutable())
        return;
    if (d->needsDetach() || size() < capacity()) {
        // must allocate memory
        DataPointer detached(size());
        if (size()) {
            if (d.needsDetach())
                detached->copyAppend(d.data(), d.data() + d.size);
            else
                detached->moveAppend(d.data(), d.data() + d.size);
        }
        d.swap(detached);
    }
    // We're detached so this is fine
    d->clearFlag(Data::CapacityReserved);
}